

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O2

CURLcode Curl_auth_create_digest_md5_message
                   (Curl_easy *data,char *chlg64,char *userp,char *passwdp,char *service,
                   char **outptr,size_t *outlen)

{
  undefined8 chlg;
  _Bool _Var1;
  CURLcode CVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *first;
  MD5_context *pMVar6;
  size_t sVar7;
  uchar *data_00;
  uchar *inputbuff;
  byte bVar8;
  bool bVar9;
  long lVar10;
  CURLcode CVar11;
  char qop [5];
  char **local_290;
  uchar digest [16];
  char nonceCount [9];
  char method [13];
  char HA1_hex [33];
  char cnonce [33];
  char HA2_hex [33];
  char nonce [64];
  char resp_hash_hex [33];
  char realm [128];
  char qop_options [64];
  char algorithm [64];
  
  builtin_strncpy(nonceCount,"00000001",9);
  builtin_strncpy(method + 8,"CATE",5);
  builtin_strncpy(method,"AUTHENTI",8);
  HA1_hex[0] = '\0';
  HA1_hex[1] = '\0';
  HA1_hex[2] = '\0';
  HA1_hex[3] = '\0';
  HA1_hex[4] = '\0';
  HA1_hex[5] = '\0';
  HA1_hex[6] = '\0';
  HA1_hex[7] = '\0';
  builtin_strncpy(qop,"auth",5);
  HA2_hex[0] = '\0';
  HA2_hex[1] = '\0';
  HA2_hex[2] = '\0';
  HA2_hex[3] = '\0';
  HA2_hex[4] = '\0';
  HA2_hex[5] = '\0';
  HA2_hex[6] = '\0';
  HA2_hex[7] = '\0';
  CVar11 = CURLE_BAD_CONTENT_ENCODING;
  CVar2 = CVar11;
  if ((((*chlg64 != '\0') && (*chlg64 != '=')) &&
      (CVar2 = Curl_base64_decode(chlg64,(uchar **)HA1_hex,(size_t *)HA2_hex), chlg = HA1_hex._0_8_,
      CVar2 == CURLE_OK)) && (CVar2 = CVar11, HA1_hex._0_8_ != 0)) {
    _Var1 = auth_digest_get_key_value((char *)HA1_hex._0_8_,"nonce=\"",nonce,0x40,'\"');
    if (_Var1) {
      _Var1 = auth_digest_get_key_value((char *)chlg,"realm=\"",realm,0x80,'\"');
      if (!_Var1) {
        realm[0] = '\0';
      }
      _Var1 = auth_digest_get_key_value((char *)chlg,"algorithm=",algorithm,0x40,',');
      if (_Var1) {
        _Var1 = auth_digest_get_key_value((char *)chlg,"qop=\"",qop_options,0x40,'\"');
        (*Curl_cfree)((void *)chlg);
        if (!_Var1) {
          return CURLE_BAD_CONTENT_ENCODING;
        }
        iVar3 = bcmp(algorithm,"md5-sess",9);
        if (iVar3 != 0) {
          return CURLE_BAD_CONTENT_ENCODING;
        }
        HA1_hex[0] = '\0';
        HA1_hex[1] = '\0';
        HA1_hex[2] = '\0';
        HA1_hex[3] = '\0';
        HA1_hex[4] = '\0';
        HA1_hex[5] = '\0';
        HA1_hex[6] = '\0';
        HA1_hex[7] = '\0';
        pcVar5 = (*Curl_cstrdup)(qop_options);
        if (pcVar5 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        local_290 = (char **)HA1_hex;
        first = strtok_r(pcVar5,",",local_290);
        bVar9 = false;
        do {
          if (first == (char *)0x0) {
            (*Curl_cfree)(pcVar5);
            if (!bVar9) {
              return CURLE_BAD_CONTENT_ENCODING;
            }
            CVar2 = Curl_rand_hex(data,(uchar *)cnonce,0x21);
            if (CVar2 != CURLE_OK) {
              return CVar2;
            }
            pMVar6 = Curl_MD5_init(Curl_DIGEST_MD5);
            CVar2 = CURLE_OUT_OF_MEMORY;
            if (pMVar6 == (MD5_context *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            sVar7 = strlen(userp);
            uVar4 = curlx_uztoui(sVar7);
            Curl_MD5_update(pMVar6,(uchar *)userp,uVar4);
            Curl_MD5_update(pMVar6,":",1);
            sVar7 = strlen(realm);
            uVar4 = curlx_uztoui(sVar7);
            Curl_MD5_update(pMVar6,(uchar *)realm,uVar4);
            Curl_MD5_update(pMVar6,":",1);
            sVar7 = strlen(passwdp);
            uVar4 = curlx_uztoui(sVar7);
            Curl_MD5_update(pMVar6,(uchar *)passwdp,uVar4);
            Curl_MD5_final(pMVar6,digest);
            pMVar6 = Curl_MD5_init(Curl_DIGEST_MD5);
            if (pMVar6 == (MD5_context *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            Curl_MD5_update(pMVar6,digest,0x10);
            Curl_MD5_update(pMVar6,":",1);
            sVar7 = strlen(nonce);
            uVar4 = curlx_uztoui(sVar7);
            Curl_MD5_update(pMVar6,(uchar *)nonce,uVar4);
            Curl_MD5_update(pMVar6,":",1);
            sVar7 = strlen(cnonce);
            uVar4 = curlx_uztoui(sVar7);
            Curl_MD5_update(pMVar6,(uchar *)cnonce,uVar4);
            Curl_MD5_final(pMVar6,digest);
            for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
              curl_msnprintf((char *)local_290,3,"%02x",(ulong)digest[lVar10]);
              local_290 = (char **)((long)local_290 + 2);
            }
            data_00 = (uchar *)Curl_auth_build_spn(service,realm,(char *)0x0);
            if (data_00 == (uchar *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            pMVar6 = Curl_MD5_init(Curl_DIGEST_MD5);
            if (pMVar6 != (MD5_context *)0x0) {
              sVar7 = strlen(method);
              uVar4 = curlx_uztoui(sVar7);
              Curl_MD5_update(pMVar6,(uchar *)method,uVar4);
              Curl_MD5_update(pMVar6,":",1);
              sVar7 = strlen((char *)data_00);
              uVar4 = curlx_uztoui(sVar7);
              Curl_MD5_update(pMVar6,data_00,uVar4);
              Curl_MD5_final(pMVar6,digest);
              pcVar5 = HA2_hex;
              for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
                curl_msnprintf(pcVar5,3,"%02x",(ulong)digest[lVar10]);
                pcVar5 = pcVar5 + 2;
              }
              pMVar6 = Curl_MD5_init(Curl_DIGEST_MD5);
              if (pMVar6 != (MD5_context *)0x0) {
                Curl_MD5_update(pMVar6,(uchar *)HA1_hex,0x20);
                Curl_MD5_update(pMVar6,":",1);
                sVar7 = strlen(nonce);
                uVar4 = curlx_uztoui(sVar7);
                Curl_MD5_update(pMVar6,(uchar *)nonce,uVar4);
                Curl_MD5_update(pMVar6,":",1);
                sVar7 = strlen(nonceCount);
                uVar4 = curlx_uztoui(sVar7);
                Curl_MD5_update(pMVar6,(uchar *)nonceCount,uVar4);
                Curl_MD5_update(pMVar6,":",1);
                sVar7 = strlen(cnonce);
                uVar4 = curlx_uztoui(sVar7);
                Curl_MD5_update(pMVar6,(uchar *)cnonce,uVar4);
                Curl_MD5_update(pMVar6,":",1);
                sVar7 = strlen(qop);
                uVar4 = curlx_uztoui(sVar7);
                Curl_MD5_update(pMVar6,(uchar *)qop,uVar4);
                Curl_MD5_update(pMVar6,":",1);
                Curl_MD5_update(pMVar6,(uchar *)HA2_hex,0x20);
                Curl_MD5_final(pMVar6,digest);
                pcVar5 = resp_hash_hex;
                for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
                  curl_msnprintf(pcVar5,3,"%02x",(ulong)digest[lVar10]);
                  pcVar5 = pcVar5 + 2;
                }
                inputbuff = (uchar *)curl_maprintf(
                                                  "username=\"%s\",realm=\"%s\",nonce=\"%s\",cnonce=\"%s\",nc=\"%s\",digest-uri=\"%s\",response=%s,qop=%s"
                                                  ,userp,realm,nonce,cnonce,nonceCount,data_00,
                                                  resp_hash_hex,qop);
                (*Curl_cfree)(data_00);
                if (inputbuff == (uchar *)0x0) {
                  return CURLE_OUT_OF_MEMORY;
                }
                CVar2 = Curl_base64_encode(data,(char *)inputbuff,0,outptr,outlen);
                data_00 = inputbuff;
              }
            }
            (*Curl_cfree)(data_00);
            return CVar2;
          }
          iVar3 = Curl_strcasecompare(first,"auth");
          bVar8 = 1;
          if (iVar3 == 0) {
            iVar3 = Curl_strcasecompare(first,"auth-int");
            bVar8 = 0;
            if (iVar3 != 0) goto LAB_004652c6;
            iVar3 = Curl_strcasecompare(first,"auth-conf");
            bVar8 = 0;
            if (iVar3 != 0) goto LAB_004652c6;
          }
          else {
LAB_004652c6:
            bVar9 = (bool)(bVar9 | bVar8);
          }
          first = strtok_r((char *)0x0,",",(char **)HA1_hex);
        } while( true );
      }
    }
    (*Curl_cfree)((void *)chlg);
  }
  return CVar2;
}

Assistant:

CURLcode Curl_auth_create_digest_md5_message(struct Curl_easy *data,
                                             const char *chlg64,
                                             const char *userp,
                                             const char *passwdp,
                                             const char *service,
                                             char **outptr, size_t *outlen)
{
  CURLcode result = CURLE_OK;
  size_t i;
  MD5_context *ctxt;
  char *response = NULL;
  unsigned char digest[MD5_DIGEST_LEN];
  char HA1_hex[2 * MD5_DIGEST_LEN + 1];
  char HA2_hex[2 * MD5_DIGEST_LEN + 1];
  char resp_hash_hex[2 * MD5_DIGEST_LEN + 1];
  char nonce[64];
  char realm[128];
  char algorithm[64];
  char qop_options[64];
  int qop_values;
  char cnonce[33];
  char nonceCount[] = "00000001";
  char method[]     = "AUTHENTICATE";
  char qop[]        = DIGEST_QOP_VALUE_STRING_AUTH;
  char *spn         = NULL;

  /* Decode the challenge message */
  result = auth_decode_digest_md5_message(chlg64, nonce, sizeof(nonce),
                                          realm, sizeof(realm),
                                          algorithm, sizeof(algorithm),
                                          qop_options, sizeof(qop_options));
  if(result)
    return result;

  /* We only support md5 sessions */
  if(strcmp(algorithm, "md5-sess") != 0)
    return CURLE_BAD_CONTENT_ENCODING;

  /* Get the qop-values from the qop-options */
  result = auth_digest_get_qop_values(qop_options, &qop_values);
  if(result)
    return result;

  /* We only support auth quality-of-protection */
  if(!(qop_values & DIGEST_QOP_VALUE_AUTH))
    return CURLE_BAD_CONTENT_ENCODING;

  /* Generate 32 random hex chars, 32 bytes + 1 zero termination */
  result = Curl_rand_hex(data, (unsigned char *)cnonce, sizeof(cnonce));
  if(result)
    return result;

  /* So far so good, now calculate A1 and H(A1) according to RFC 2831 */
  ctxt = Curl_MD5_init(Curl_DIGEST_MD5);
  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  Curl_MD5_update(ctxt, (const unsigned char *) userp,
                  curlx_uztoui(strlen(userp)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) realm,
                  curlx_uztoui(strlen(realm)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) passwdp,
                  curlx_uztoui(strlen(passwdp)));
  Curl_MD5_final(ctxt, digest);

  ctxt = Curl_MD5_init(Curl_DIGEST_MD5);
  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  Curl_MD5_update(ctxt, (const unsigned char *) digest, MD5_DIGEST_LEN);
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) nonce,
                  curlx_uztoui(strlen(nonce)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) cnonce,
                  curlx_uztoui(strlen(cnonce)));
  Curl_MD5_final(ctxt, digest);

  /* Convert calculated 16 octet hex into 32 bytes string */
  for(i = 0; i < MD5_DIGEST_LEN; i++)
    msnprintf(&HA1_hex[2 * i], 3, "%02x", digest[i]);

  /* Generate our SPN */
  spn = Curl_auth_build_spn(service, realm, NULL);
  if(!spn)
    return CURLE_OUT_OF_MEMORY;

  /* Calculate H(A2) */
  ctxt = Curl_MD5_init(Curl_DIGEST_MD5);
  if(!ctxt) {
    free(spn);

    return CURLE_OUT_OF_MEMORY;
  }

  Curl_MD5_update(ctxt, (const unsigned char *) method,
                  curlx_uztoui(strlen(method)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) spn,
                  curlx_uztoui(strlen(spn)));
  Curl_MD5_final(ctxt, digest);

  for(i = 0; i < MD5_DIGEST_LEN; i++)
    msnprintf(&HA2_hex[2 * i], 3, "%02x", digest[i]);

  /* Now calculate the response hash */
  ctxt = Curl_MD5_init(Curl_DIGEST_MD5);
  if(!ctxt) {
    free(spn);

    return CURLE_OUT_OF_MEMORY;
  }

  Curl_MD5_update(ctxt, (const unsigned char *) HA1_hex, 2 * MD5_DIGEST_LEN);
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) nonce,
                  curlx_uztoui(strlen(nonce)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);

  Curl_MD5_update(ctxt, (const unsigned char *) nonceCount,
                  curlx_uztoui(strlen(nonceCount)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) cnonce,
                  curlx_uztoui(strlen(cnonce)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) qop,
                  curlx_uztoui(strlen(qop)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);

  Curl_MD5_update(ctxt, (const unsigned char *) HA2_hex, 2 * MD5_DIGEST_LEN);
  Curl_MD5_final(ctxt, digest);

  for(i = 0; i < MD5_DIGEST_LEN; i++)
    msnprintf(&resp_hash_hex[2 * i], 3, "%02x", digest[i]);

  /* Generate the response */
  response = aprintf("username=\"%s\",realm=\"%s\",nonce=\"%s\","
                     "cnonce=\"%s\",nc=\"%s\",digest-uri=\"%s\",response=%s,"
                     "qop=%s",
                     userp, realm, nonce,
                     cnonce, nonceCount, spn, resp_hash_hex, qop);
  free(spn);
  if(!response)
    return CURLE_OUT_OF_MEMORY;

  /* Base64 encode the response */
  result = Curl_base64_encode(data, response, 0, outptr, outlen);

  free(response);

  return result;
}